

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.cpp
# Opt level: O0

int __thiscall
x86Instruction::Decode(x86Instruction *this,CodeGenRegVmStateContext *ctx,char *buf,uint bufSize)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  bool local_47;
  bool local_46;
  bool local_45;
  bool local_44;
  bool local_43;
  bool local_42;
  bool local_41;
  uint local_34;
  bool useMmWord_1;
  bool usex64_1;
  bool useMmWord;
  bool usex64;
  uint width;
  char *curr;
  uint bufSize_local;
  char *buf_local;
  CodeGenRegVmStateContext *ctx_local;
  x86Instruction *this_local;
  
  _useMmWord_1 = buf;
  if ((ctx->vsAsmStyle & 1U) != 0) {
    _useMmWord_1 = buf + 1;
    *buf = ' ';
  }
  if (this->name == o_label) {
    iVar1 = NULLC::SafeSprintf(_useMmWord_1,(ulong)(bufSize - ((int)_useMmWord_1 - (int)buf)),
                               "0x%p:",(ulong)(this->field_4).labelID);
    _useMmWord_1 = _useMmWord_1 + iVar1;
  }
  else if (this->name == o_other) {
    strcpy(_useMmWord_1,"  ; ");
    sVar2 = strlen(_useMmWord_1);
    _useMmWord_1 = _useMmWord_1 + sVar2;
    strcpy(_useMmWord_1,(this->field_4).comment);
    sVar2 = strlen(_useMmWord_1);
    _useMmWord_1 = _useMmWord_1 + sVar2;
  }
  else {
    strcpy(_useMmWord_1,*(char **)((anonymous_namespace)::x86CmdText + (ulong)this->name * 8));
    sVar2 = strlen(_useMmWord_1);
    _useMmWord_1 = _useMmWord_1 + sVar2;
    if ((ctx->vsAsmStyle & 1U) != 0) {
      sVar2 = strlen(*(char **)((anonymous_namespace)::x86CmdText + (ulong)this->name * 8));
      for (local_34 = (uint)sVar2; local_34 < 0xb; local_34 = local_34 + 1) {
        *_useMmWord_1 = ' ';
        _useMmWord_1 = _useMmWord_1 + 1;
      }
    }
  }
  if (this->name != o_none) {
    if ((this->argA).type != argNone) {
      *_useMmWord_1 = ' ';
      local_41 = true;
      if (((((int)this->name < 0x4d) && (local_41 = true, this->name != o_movsxd)) &&
          (local_41 = true, (this->argA).type != argPtr)) &&
         (((local_41 = true, this->name != o_call && (local_41 = true, this->name != o_push)) &&
          (local_41 = true, this->name != o_pop)))) {
        local_42 = false;
        if (((this->argB).type == argPtr) && (local_42 = false, (this->argB).field_1.reg == rEDX)) {
          local_42 = this->name != o_cvttsd2si;
        }
        local_41 = local_42;
      }
      local_43 = false;
      if ((ctx->vsAsmStyle & 1U) != 0) {
        local_43 = (this->argB).type == argXmmReg;
      }
      iVar1 = x86Argument::Decode(&this->argA,ctx,_useMmWord_1 + 1,bufSize,local_41,local_43,
                                  this->name == o_lea);
      _useMmWord_1 = _useMmWord_1 + 1 + iVar1;
    }
    if ((this->argB).type != argNone) {
      *_useMmWord_1 = ',';
      pcVar3 = _useMmWord_1 + 1;
      if ((ctx->vsAsmStyle & 1U) == 0) {
        _useMmWord_1[1] = ' ';
        pcVar3 = _useMmWord_1 + 2;
      }
      _useMmWord_1 = pcVar3;
      local_44 = true;
      if ((((int)this->name < 0x4d) && (local_44 = true, (this->argB).type != argPtr)) &&
         (local_44 = true, this->name != o_movsxd)) {
        local_45 = false;
        if ((this->argA).type == argPtr) {
          local_45 = (this->argA).field_1.reg == rEDX;
        }
        local_44 = local_45;
      }
      local_46 = false;
      if ((ctx->vsAsmStyle & 1U) != 0) {
        local_47 = true;
        if (((this->argA).type != argXmmReg) && (local_47 = true, this->name != o_cvttsd2si)) {
          local_47 = this->name == o_cvttsd2si64;
        }
        local_46 = local_47;
      }
      iVar1 = x86Argument::Decode(&this->argB,ctx,_useMmWord_1,bufSize,local_44,local_46,
                                  this->name == o_lea);
      _useMmWord_1 = _useMmWord_1 + iVar1;
    }
  }
  if ((ctx->vsAsmStyle & 1U) != 0) {
    pcVar3 = _useMmWord_1 + 1;
    *_useMmWord_1 = ' ';
    _useMmWord_1 = _useMmWord_1 + 2;
    *pcVar3 = ' ';
    *_useMmWord_1 = '\0';
  }
  if (_useMmWord_1 < buf + bufSize) {
    __assert_fail("buf + bufSize <= curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Instruction_X86.cpp"
                  ,0x115,
                  "int x86Instruction::Decode(CodeGenRegVmStateContext &, char *, unsigned int)");
  }
  return (int)_useMmWord_1 - (int)buf;
}

Assistant:

int	x86Instruction::Decode(CodeGenRegVmStateContext &ctx, char *buf, unsigned bufSize)
{
	char *curr = buf;

	if(ctx.vsAsmStyle)
		*curr++ = ' ';

	if(name == o_label)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "0x%p:", (void*)(intptr_t)labelID);
	}
	else if(name == o_other)
	{
		strcpy(curr, "  ; ");
		curr += strlen(curr);

		strcpy(curr, comment);
		curr += strlen(curr);
	}
	else
	{
		strcpy(curr, x86CmdText[name]);
		curr += strlen(curr);

		if(ctx.vsAsmStyle)
		{
			for(unsigned width = (unsigned)strlen(x86CmdText[name]); width < 11; width++)
				*curr++ = ' ';
		}
	}

	if(name != o_none)
	{
		if(argA.type != x86Argument::argNone)
		{
			*curr++ = ' ';

			bool usex64 = name >= o_mov64 || name == o_movsxd || ((argA.type == x86Argument::argPtr || name == o_call || name == o_push || name == o_pop) && sizeof(void*) == 8) || (argB.type == x86Argument::argPtr && argB.ptrSize == sQWORD && name != o_cvttsd2si);
			bool useMmWord = ctx.vsAsmStyle && argB.type == x86Argument::argXmmReg;

			curr += argA.Decode(ctx, curr, bufSize, usex64, useMmWord, name == o_lea);
		}
		if(argB.type != x86Argument::argNone)
		{
			*curr++ = ',';

			if(!ctx.vsAsmStyle)
				*curr++ = ' ';

			bool usex64 = name >= o_mov64 || (argB.type == x86Argument::argPtr && sizeof(void*) == 8) || name == o_movsxd || (argA.type == x86Argument::argPtr && argA.ptrSize == sQWORD);
			bool useMmWord = ctx.vsAsmStyle && (argA.type == x86Argument::argXmmReg || name == o_cvttsd2si || name == o_cvttsd2si64);

			curr += argB.Decode(ctx, curr, bufSize, usex64, useMmWord, name == o_lea);
		}
	}

	if(ctx.vsAsmStyle)
	{
		*curr++ = ' ';
		*curr++ = ' ';
		*curr = 0;
	}

	assert(buf + bufSize <= curr);
	return int(curr - buf);
}